

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

int lj_tab_isempty(GCtab *t)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = 0;
  while (t->asize != uVar2) {
    lVar1 = uVar2 * 8;
    uVar2 = uVar2 + 1;
    if (*(long *)((t->array).ptr64 + lVar1) != -1) {
      return 0;
    }
  }
  if (t->hmask != 0) {
    uVar3 = 0;
    do {
      if (t->hmask < uVar3) {
        return 1;
      }
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (*(long *)((t->node).ptr64 + uVar2 * 0x18) == -1);
    return 0;
  }
  return 1;
}

Assistant:

int LJ_FASTCALL lj_tab_isempty(const GCtab *t)
{
  MSize narr = (MSize)t->asize;
  cTValue *e;
  Node *node;
  MSize i;

  e = tvref(t->array);
  for (i = 0; i < narr; i++)
    if (LJ_LIKELY(!tvisnil(&e[i])))
      return 0;

  if (t->hmask <= 0)
    return 1;

  node = noderef(t->node);
  for (i = 0; i <= (MSize)t->hmask; i++) {
    Node *n = &node[i];
    if (LJ_LIKELY(!tvisnil(&n->val))) {
      return 0;
    }
  }

  return 1;
}